

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Style.cpp
# Opt level: O0

void __thiscall Style::Style::buildFromXML(Style *this,xml_document<char> *doc)

{
  int iVar1;
  xml_node<char> *pxVar2;
  char *__s1;
  logic_error *this_00;
  vector<Style::SourceMap,_std::allocator<Style::SourceMap>_> local_130;
  char *local_118;
  char *name;
  xml_node<char> *node;
  vector<Style::SourceMap,_std::allocator<Style::SourceMap>_> sourcemaps;
  undefined1 auStack_e8 [8];
  unordered_map<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field,_std::hash<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>_>_>
  fields;
  undefined1 auStack_a8 [8];
  unordered_map<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>,_std::hash<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>_>_>_>
  entryFields;
  undefined1 auStack_68 [8];
  vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
  universalFields;
  undefined1 auStack_48 [8];
  vector<Style::TempConstraintData,_std::allocator<Style::TempConstraintData>_> tempConstraints;
  xml_document<char> *doc_local;
  Style *this_local;
  
  std::operator<<((ostream *)&std::cerr,"constructing Style from xml...\n");
  pxVar2 = rapidxml::xml_node<char>::first_node(&doc->super_xml_node<char>,(char *)0x0,0,true);
  __s1 = rapidxml::xml_base<char>::name(&pxVar2->super_xml_base<char>);
  iVar1 = strcmp(__s1,"bcf:controlfile");
  if (iVar1 == 0) {
    auStack_48 = (undefined1  [8])0x0;
    tempConstraints.
    super__Vector_base<Style::TempConstraintData,_std::allocator<Style::TempConstraintData>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    tempConstraints.
    super__Vector_base<Style::TempConstraintData,_std::allocator<Style::TempConstraintData>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<Style::TempConstraintData,_std::allocator<Style::TempConstraintData>_>::vector
              ((vector<Style::TempConstraintData,_std::allocator<Style::TempConstraintData>_> *)
               auStack_48);
    auStack_68 = (undefined1  [8])0x0;
    universalFields.
    super__Vector_base<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    universalFields.
    super__Vector_base<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
              *)auStack_68);
    entryFields._M_h._M_element_count = 0;
    entryFields._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    entryFields._M_h._M_rehash_policy._4_4_ = 0;
    entryFields._M_h._M_bucket_count = 0;
    entryFields._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    auStack_a8 = (undefined1  [8])0x0;
    entryFields._M_h._M_buckets = (__buckets_ptr)0x0;
    entryFields._M_h._M_rehash_policy._M_next_resize = 0;
    std::
    unordered_map<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>,_std::hash<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>_>_>_>
    ::unordered_map((unordered_map<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>,_std::hash<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>_>_>_>
                     *)auStack_a8);
    fields._M_h._M_element_count = 0;
    fields._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    fields._M_h._M_rehash_policy._4_4_ = 0;
    fields._M_h._M_bucket_count = 0;
    fields._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    auStack_e8 = (undefined1  [8])0x0;
    fields._M_h._M_buckets = (__buckets_ptr)0x0;
    fields._M_h._M_rehash_policy._M_next_resize = 0;
    std::
    unordered_map<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field,_std::hash<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>_>_>
    ::unordered_map((unordered_map<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field,_std::hash<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>_>_>
                     *)auStack_e8);
    node = (xml_node<char> *)0x0;
    sourcemaps.super__Vector_base<Style::SourceMap,_std::allocator<Style::SourceMap>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    sourcemaps.super__Vector_base<Style::SourceMap,_std::allocator<Style::SourceMap>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<Style::SourceMap,_std::allocator<Style::SourceMap>_>::vector
              ((vector<Style::SourceMap,_std::allocator<Style::SourceMap>_> *)&node);
    pxVar2 = rapidxml::xml_node<char>::first_node(&doc->super_xml_node<char>,(char *)0x0,0,true);
    for (name = (char *)rapidxml::xml_node<char>::first_node(pxVar2,(char *)0x0,0,true);
        name != (char *)0x0;
        name = (char *)rapidxml::xml_node<char>::next_sibling
                                 ((xml_node<char> *)name,(char *)0x0,0,true)) {
      local_118 = rapidxml::xml_base<char>::name((xml_base<char> *)name);
      iVar1 = strcmp(local_118 + 4,"sourcemap");
      if (iVar1 == 0) {
        parseSourcemap(this,(xml_node<char> *)name,
                       (vector<Style::SourceMap,_std::allocator<Style::SourceMap>_> *)&node);
      }
      else {
        iVar1 = strcmp(local_118 + 4,"datamodel");
        if (iVar1 == 0) {
          parseDatamodel(this,(xml_node<char> *)name,
                         (vector<Style::TempConstraintData,_std::allocator<Style::TempConstraintData>_>
                          *)auStack_48,
                         (vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
                          *)auStack_68,
                         (unordered_map<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>,_std::hash<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>_>_>_>
                          *)auStack_a8,
                         (unordered_map<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field,_std::hash<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>_>_>
                          *)auStack_e8);
        }
      }
    }
    applyGlobalDataConstraints
              ((unordered_map<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field,_std::hash<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>_>_>
                *)auStack_e8,
               (vector<Style::TempConstraintData,_std::allocator<Style::TempConstraintData>_> *)
               auStack_48);
    buildEntryFields(this,(vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
                           *)auStack_68,
                     (unordered_map<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>,_std::hash<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>_>_>_>
                      *)auStack_a8,
                     (unordered_map<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field,_std::hash<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>_>_>
                      *)auStack_e8);
    addEntryConstraints(this,(vector<Style::TempConstraintData,_std::allocator<Style::TempConstraintData>_>
                              *)auStack_48);
    consolidateEntryConstraints(this);
    std::vector<Style::SourceMap,_std::allocator<Style::SourceMap>_>::vector
              (&local_130,(vector<Style::SourceMap,_std::allocator<Style::SourceMap>_> *)&node);
    applySourcemaps(this,&local_130);
    std::vector<Style::SourceMap,_std::allocator<Style::SourceMap>_>::~vector(&local_130);
    std::vector<Style::SourceMap,_std::allocator<Style::SourceMap>_>::~vector
              ((vector<Style::SourceMap,_std::allocator<Style::SourceMap>_> *)&node);
    std::
    unordered_map<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field,_std::hash<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>_>_>
    ::~unordered_map((unordered_map<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field,_std::hash<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>_>_>
                      *)auStack_e8);
    std::
    unordered_map<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>,_std::hash<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>_>_>_>
    ::~unordered_map((unordered_map<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>,_std::hash<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>_>_>_>
                      *)auStack_a8);
    std::
    vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
               *)auStack_68);
    std::vector<Style::TempConstraintData,_std::allocator<Style::TempConstraintData>_>::~vector
              ((vector<Style::TempConstraintData,_std::allocator<Style::TempConstraintData>_> *)
               auStack_48);
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"Unexpected node name");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void Style::buildFromXML (xml_document<> &doc) {
    std::cerr << "constructing Style from xml...\n";
    EXPECT_NAME(doc.first_node(), "bcf:controlfile");
    // NOTE: bcf:options component="biber" contains encoding information.
    //  We will assume it's always UTF-8 for now.

    vector<TempConstraintData> tempConstraints {};
    vector<u16string> universalFields {};
    unordered_map<u16string, vector<u16string>> entryFields {};
    unordered_map<u16string, Field> fields {};

    vector<SourceMap> sourcemaps {};

    for (xml_node<> *node = doc.first_node()->first_node(); node; node = node->next_sibling()) {
        const char *name = node->name();
        if (IS("sourcemap")) {
            parseSourcemap(node, sourcemaps);
        } else if (IS("datamodel")) {
            parseDatamodel(node, tempConstraints, universalFields, entryFields, fields);
        }
    }

    applyGlobalDataConstraints(fields, tempConstraints);

    buildEntryFields(universalFields, entryFields, fields);

    addEntryConstraints(tempConstraints);

    if (CONSOLIDATE_CONSTRAINTS) consolidateEntryConstraints();

    applySourcemaps(sourcemaps);
}